

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O0

void print_result(int f,float res,float param_3,v_array<char> tag)

{
  v_array<char> tag_00;
  long lVar1;
  ssize_t sVar2;
  ostream *poVar3;
  int *piVar4;
  char *pcVar5;
  int in_EDI;
  float in_XMM0_Da;
  float fVar6;
  void *in_stack_00000008;
  undefined8 in_stack_00000010;
  ssize_t t;
  ssize_t len;
  stringstream ss;
  char temp [30];
  int f_00;
  stringstream *in_stack_fffffffffffffd80;
  undefined8 in_stack_fffffffffffffd90;
  undefined8 in_stack_fffffffffffffd98;
  string *this;
  undefined8 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  string local_248 [32];
  long local_228;
  string local_220 [32];
  long local_200;
  stringstream local_1c0 [16];
  ostream local_1b0;
  char local_38 [48];
  float local_8;
  
  if (-1 < in_EDI) {
    local_8 = in_XMM0_Da;
    fVar6 = floorf(in_XMM0_Da);
    if ((fVar6 != local_8) || (NAN(fVar6) || NAN(local_8))) {
      sprintf(local_38,"%f",SUB84((double)local_8,0));
    }
    else {
      sprintf(local_38,"%.0f",SUB84((double)local_8,0));
    }
    std::__cxx11::stringstream::stringstream(local_1c0);
    std::operator<<(&local_1b0,local_38);
    tag_00._end = (char *)in_stack_fffffffffffffd98;
    tag_00._begin = (char *)in_stack_fffffffffffffd90;
    tag_00.end_array = (char *)in_stack_fffffffffffffda0;
    tag_00.erase_count._0_4_ = in_stack_fffffffffffffda8;
    tag_00.erase_count._4_4_ = in_stack_fffffffffffffdac;
    f_00 = in_stack_00000010._4_4_;
    print_tag(in_stack_fffffffffffffd80,tag_00);
    std::operator<<(&local_1b0,'\n');
    std::__cxx11::stringstream::str();
    this = local_220;
    lVar1 = std::__cxx11::string::size();
    std::__cxx11::string::~string(this);
    local_200 = lVar1;
    std::__cxx11::stringstream::str();
    std::__cxx11::string::c_str();
    sVar2 = io_buf::write_file_or_socket(f_00,in_stack_00000008,0x3561cf);
    std::__cxx11::string::~string(local_248);
    local_228 = sVar2;
    if (sVar2 != local_200) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"write error: ");
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      poVar3 = std::operator<<(poVar3,pcVar5);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::stringstream::~stringstream(local_1c0);
  }
  return;
}

Assistant:

void print_result(int f, float res, float, v_array<char> tag)
{
  if (f >= 0)
  {
    char temp[30];
    if (floorf(res) != res)
      sprintf(temp, "%f", res);
    else
      sprintf(temp, "%.0f", res);
    std::stringstream ss;
    ss << temp;
    print_tag(ss, tag);
    ss << '\n';
    ssize_t len = ss.str().size();
    ssize_t t = io_buf::write_file_or_socket(f, ss.str().c_str(), (unsigned int)len);
    if (t != len)
    {
      cerr << "write error: " << strerror(errno) << endl;
    }
  }
}